

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_constants_mon_play(parser *p)

{
  undefined2 uVar1;
  wchar_t wVar2;
  int iVar3;
  void *pvVar4;
  char *__s1;
  wchar_t value;
  char *label;
  angband_constants *z;
  parser *p_local;
  
  pvVar4 = parser_priv(p);
  __s1 = parser_getsym(p,"label");
  wVar2 = parser_getint(p,"value");
  if (wVar2 < L'\0') {
    p_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    iVar3 = strcmp(__s1,"break-glyph");
    uVar1 = (undefined2)wVar2;
    if (iVar3 == 0) {
      *(undefined2 *)((long)pvVar4 + 0x48) = uVar1;
    }
    else {
      iVar3 = strcmp(__s1,"mult-rate");
      if (iVar3 == 0) {
        *(undefined2 *)((long)pvVar4 + 0x4a) = uVar1;
      }
      else {
        iVar3 = strcmp(__s1,"life-drain");
        if (iVar3 == 0) {
          *(undefined2 *)((long)pvVar4 + 0x4c) = uVar1;
        }
        else {
          iVar3 = strcmp(__s1,"flee-range");
          if (iVar3 == 0) {
            *(undefined2 *)((long)pvVar4 + 0x4e) = uVar1;
          }
          else {
            iVar3 = strcmp(__s1,"turn-range");
            if (iVar3 != 0) {
              return PARSE_ERROR_UNDEFINED_DIRECTIVE;
            }
            *(undefined2 *)((long)pvVar4 + 0x50) = uVar1;
          }
        }
      }
    }
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_constants_mon_play(struct parser *p) {
	struct angband_constants *z;
	const char *label;
	int value;

	z = parser_priv(p);
	label = parser_getsym(p, "label");
	value = parser_getint(p, "value");

	if (value < 0)
		return PARSE_ERROR_INVALID_VALUE;

	if (streq(label, "break-glyph"))
		z->glyph_hardness = value;
	else if (streq(label, "mult-rate"))
		z->repro_monster_rate = value;
	else if (streq(label, "life-drain"))
		z->life_drain_percent = value;
	else if (streq(label, "flee-range"))
		z->flee_range = value;
	else if (streq(label, "turn-range"))
		z->turn_range = value;
	else
		return PARSE_ERROR_UNDEFINED_DIRECTIVE;

	return PARSE_ERROR_NONE;
}